

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O3

int __thiscall LinkedObjectFile::get_label_at(LinkedObjectFile *this,int seg,int offset)

{
  pointer puVar1;
  int iVar2;
  const_iterator cVar3;
  ulong uVar4;
  ulong uVar5;
  int local_1c;
  
  uVar5 = (ulong)seg;
  puVar1 = (this->label_per_seg_by_offset).
           super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = ((long)(this->label_per_seg_by_offset).
                 super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) *
          0x6db6db6db6db6db7;
  local_1c = offset;
  if (uVar5 <= uVar4 && uVar4 - uVar5 != 0) {
    cVar3 = std::
            _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&puVar1[uVar5]._M_h,&local_1c);
    uVar4 = ((long)(this->label_per_seg_by_offset).
                   super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->label_per_seg_by_offset).
                   super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
    if (uVar5 <= uVar4 && uVar4 - uVar5 != 0) {
      if (cVar3.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur ==
          (__node_type *)0x0) {
        iVar2 = -1;
      }
      else {
        iVar2 = *(int *)((long)cVar3.super__Node_iterator_base<std::pair<const_int,_int>,_false>.
                               _M_cur + 0xc);
      }
      return iVar2;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5);
}

Assistant:

int LinkedObjectFile::get_label_at(int seg, int offset) const {
  auto kv = label_per_seg_by_offset.at(seg).find(offset);
  if (kv == label_per_seg_by_offset.at(seg).end()) {
    return -1;
  }

  return kv->second;
}